

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deSharedPtr.hpp
# Opt level: O0

void __thiscall
de::SharedPtr<LogFileReader>::SharedPtr(SharedPtr<LogFileReader> *this,LogFileReader *ptr)

{
  LogFileReader *pLVar1;
  SharedPtrState<LogFileReader,_de::DefaultDeleter<LogFileReader>_> *pSVar2;
  DefaultDeleter<LogFileReader> local_25 [13];
  LogFileReader *local_18;
  LogFileReader *ptr_local;
  SharedPtr<LogFileReader> *this_local;
  
  this->m_ptr = (LogFileReader *)0x0;
  this->m_state = (SharedPtrStateBase *)0x0;
  this->m_ptr = ptr;
  local_18 = ptr;
  ptr_local = (LogFileReader *)this;
  pSVar2 = (SharedPtrState<LogFileReader,_de::DefaultDeleter<LogFileReader>_> *)operator_new(0x20);
  pLVar1 = local_18;
  DefaultDeleter<LogFileReader>::DefaultDeleter(local_25);
  SharedPtrState<LogFileReader,_de::DefaultDeleter<LogFileReader>_>::SharedPtrState(pSVar2,pLVar1);
  this->m_state = (SharedPtrStateBase *)pSVar2;
  this->m_state->strongRefCount = 1;
  this->m_state->weakRefCount = 1;
  return;
}

Assistant:

inline SharedPtr<T>::SharedPtr (T* ptr)
	: m_ptr		(DE_NULL)
	, m_state	(DE_NULL)
{
	try
	{
		m_ptr	= ptr;
		m_state	= new SharedPtrState<T, DefaultDeleter<T> >(ptr, DefaultDeleter<T>());
		m_state->strongRefCount	= 1;
		m_state->weakRefCount	= 1;
	}
	catch (...)
	{
		// \note ptr is not released.
		delete m_state;
		throw;
	}
}